

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O0

void pp_tree_avl_rotate_right_left(PTreeAVLNode *node,PTreeBaseNode **root)

{
  PTreeAVLNode_ *pPVar1;
  PTreeAVLNode *tmp_node;
  PTreeBaseNode **root_local;
  PTreeAVLNode *node_local;
  
  pPVar1 = (PTreeAVLNode_ *)(node->base).left;
  (node->base).left = (pPVar1->base).right;
  if ((node->base).left != (PTreeBaseNode_ *)0x0) {
    (node->base).left[1].left = &node->base;
  }
  pPVar1->parent = node->parent->parent;
  if (pPVar1->parent == (PTreeAVLNode_ *)0x0) {
    *root = (PTreeBaseNode *)pPVar1;
  }
  else if ((PTreeAVLNode_ *)(pPVar1->parent->base).left == node->parent) {
    (pPVar1->parent->base).left = (PTreeBaseNode_ *)pPVar1;
  }
  else {
    (pPVar1->parent->base).right = (PTreeBaseNode_ *)pPVar1;
  }
  (node->parent->base).right = (pPVar1->base).left;
  if ((node->parent->base).right != (PTreeBaseNode_ *)0x0) {
    (node->parent->base).right[1].left = &node->parent->base;
  }
  (pPVar1->base).left = &node->parent->base;
  (pPVar1->base).left[1].left = (PTreeBaseNode_ *)pPVar1;
  (pPVar1->base).right = &node->base;
  node->parent = pPVar1;
  if (pPVar1->balance_factor == 1) {
    *(undefined4 *)&(pPVar1->base).left[1].right = 0;
    *(undefined4 *)&(pPVar1->base).right[1].right = 0xffffffff;
  }
  else if (pPVar1->balance_factor == -1) {
    *(undefined4 *)&(pPVar1->base).left[1].right = 1;
    *(undefined4 *)&(pPVar1->base).right[1].right = 0;
  }
  else {
    *(undefined4 *)&(pPVar1->base).left[1].right = 0;
    *(undefined4 *)&(pPVar1->base).right[1].right = 0;
  }
  pPVar1->balance_factor = 0;
  return;
}

Assistant:

static void
pp_tree_avl_rotate_right_left (PTreeAVLNode *node, PTreeBaseNode **root)
{
	PTreeAVLNode *tmp_node;

	tmp_node = (PTreeAVLNode *) node->base.left;
	node->base.left = tmp_node->base.right;

	if (node->base.left != NULL)
		((PTreeAVLNode *) node->base.left)->parent = node;

	tmp_node->parent = node->parent->parent;

	if (P_LIKELY (tmp_node->parent != NULL)) {
		if (tmp_node->parent->base.left == (PTreeBaseNode *) node->parent)
			tmp_node->parent->base.left = (PTreeBaseNode *) tmp_node;
		else
			tmp_node->parent->base.right = (PTreeBaseNode *) tmp_node;
	} else
		*root = (PTreeBaseNode *) tmp_node;

	node->parent->base.right = tmp_node->base.left;

	if (node->parent->base.right != NULL)
		((PTreeAVLNode *) node->parent->base.right)->parent = node->parent;

	tmp_node->base.left = (PTreeBaseNode *) node->parent;
	((PTreeAVLNode *) tmp_node->base.left)->parent = tmp_node;

	tmp_node->base.right = (PTreeBaseNode *) node;
	node->parent = tmp_node;

	/* Restore balance factor */
	if (tmp_node->balance_factor == 1) {
		((PTreeAVLNode *) tmp_node->base.left)->balance_factor  = 0;
		((PTreeAVLNode *) tmp_node->base.right)->balance_factor = -1;
	} else if (tmp_node->balance_factor == -1) {
		((PTreeAVLNode *) tmp_node->base.left)->balance_factor  = 1;
		((PTreeAVLNode *) tmp_node->base.right)->balance_factor = 0;
	} else {
		((PTreeAVLNode *) tmp_node->base.left)->balance_factor  = 0;
		((PTreeAVLNode *) tmp_node->base.right)->balance_factor = 0;
	}

	tmp_node->balance_factor = 0;
}